

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac.c
# Opt level: O3

int omac_key(OMAC_CTX *c,EVP_CIPHER *cipher,uchar *key,size_t key_size)

{
  int iVar1;
  int iVar2;
  CMAC_CTX *ctx;
  
  CMAC_CTX_free((CMAC_CTX *)c->cmac_ctx);
  ctx = CMAC_CTX_new();
  c->cmac_ctx = (CMAC_CTX *)ctx;
  if (ctx == (CMAC_CTX *)0x0) {
    ERR_GOST_error(0x8a,0xc0100,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac.c"
                   ,0x91);
    iVar2 = 0;
  }
  else {
    iVar1 = CMAC_Init(ctx,key,0x20,(EVP_CIPHER *)cipher,(ENGINE *)0x0);
    iVar2 = 1;
    if (0 < iVar1) {
      c->key_set = 1;
    }
  }
  return iVar2;
}

Assistant:

static int omac_key(OMAC_CTX * c, const EVP_CIPHER *cipher,
                    const unsigned char *key, size_t key_size)
{
    int ret = 0;

    CMAC_CTX_free(c->cmac_ctx);
    c->cmac_ctx = CMAC_CTX_new();
    if (c->cmac_ctx == NULL) {
        GOSTerr(GOST_F_OMAC_KEY, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    ret = CMAC_Init(c->cmac_ctx, key, key_size, cipher, NULL);
    if (ret > 0) {
        c->key_set = 1;
    }
    return 1;
}